

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O1

bool ndiSocketOpen(char *hostname,int port,NDISocketHandle *outSocket)

{
  int __fd;
  int iVar1;
  in_addr_t iVar2;
  hostent *phVar3;
  bool bVar4;
  int on;
  sockaddr_in name;
  undefined4 local_3c;
  sockaddr local_38;
  
  bVar4 = false;
  __fd = socket(2,1,0);
  local_3c = 1;
  iVar1 = setsockopt(__fd,6,1,&local_3c,4);
  if (iVar1 == 0) {
    phVar3 = gethostbyname(hostname);
    if (phVar3 == (hostent *)0x0) {
      iVar2 = inet_addr(hostname);
      local_38._0_8_ = ZEXT48(iVar2);
      phVar3 = gethostbyaddr(&local_38,8,2);
    }
    if (phVar3 == (hostent *)0x0) {
      bVar4 = false;
    }
    else {
      local_38.sa_family = 2;
      memcpy(local_38.sa_data + 2,*phVar3->h_addr_list,(long)phVar3->h_length);
      local_38.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = connect(__fd,&local_38,0x10);
      bVar4 = iVar1 >= 0;
      if (iVar1 < 0) {
        shutdown(__fd,2);
        close(__fd);
      }
      else {
        *outSocket = __fd;
      }
    }
  }
  return bVar4;
}

Assistant:

ndicapiExport bool ndiSocketOpen(const char* hostname, int port, NDISocketHandle& outSocket)
{
  NDISocketHandle sock = socket(AF_INET, SOCK_STREAM, 0);

  // Eliminate windows 0.2 second delay sending (buffering) data.
  int on = 1;
  if (setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char*)&on, sizeof(on)))
  {
    return false;
  }

  struct hostent* hp;
  hp = gethostbyname(hostname);
  if (!hp)
  {
    unsigned long addr = inet_addr(hostname);
    hp = gethostbyaddr((char*)&addr, sizeof(addr), AF_INET);
  }

  if (!hp)
  {
    return false;
  }

  struct sockaddr_in name;
  name.sin_family = AF_INET;
  memcpy(&name.sin_addr, hp->h_addr, hp->h_length);
  name.sin_port = htons(port);

  int r = connect(sock, reinterpret_cast<sockaddr*>(&name), sizeof(name));

  if (r < 0)
  {
    shutdown(sock, 2);
    close(sock);
    return false;
  }

  outSocket = sock;
  return true;
}